

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

void __thiscall
vkt::memory::anon_unknown_0::BufferCopyFromBuffer::prepare
          (BufferCopyFromBuffer *this,PrepareContext *context)

{
  Move<vk::Handle<(vk::HandleType)7>_> *pMVar1;
  Context *pCVar2;
  InstanceInterface *vki;
  DeviceInterface *vk;
  VkPhysicalDevice physicalDevice;
  VkDevice device;
  VkBuffer obj;
  VkDeviceMemory obj_00;
  undefined8 uVar3;
  VkResult result;
  deUint32 dVar4;
  VkDeviceSize size;
  ulong uVar5;
  Random rng;
  VkMemoryPropertyFlags in_stack_ffffffffffffff48;
  Move<vk::Handle<(vk::HandleType)7>_> local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  undefined1 local_68 [20];
  uint uStack_54;
  VkAllocationCallbacks *pVStack_50;
  undefined8 local_48;
  deUint32 local_40;
  pointer local_38;
  
  pCVar2 = context->m_context;
  vki = pCVar2->m_vki;
  vk = pCVar2->m_vkd;
  physicalDevice = pCVar2->m_physicalDevice;
  device = pCVar2->m_device;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_80,&pCVar2->m_queueFamilies);
  pVStack_50 = (VkAllocationCallbacks *)context->m_currentBufferSize;
  this->m_bufferSize = (VkDeviceSize)pVStack_50;
  local_68._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_68._8_8_ = (void *)0x0;
  stack0xffffffffffffffa8 = (VkDevice)((ulong)uStack_54 << 0x20);
  local_48._0_4_ = 1;
  local_48._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
  local_40 = (deUint32)
             ((ulong)((long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 2);
  local_38 = local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&local_a8,vk,device,
                     (VkBufferCreateInfo *)local_68,(VkAllocationCallbacks *)0x0);
  stack0xffffffffffffffa8 =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
  pVStack_50 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator;
  local_68._0_8_ = local_a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
  local_68._8_8_ =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = 0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&(this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,obj
              );
  }
  (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       stack0xffffffffffffffa8;
  (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       pVStack_50;
  (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       local_68._0_8_;
  (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_68._8_8_;
  if (local_a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)
               &local_a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,
               (VkBuffer)
               local_a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal);
  }
  bindBufferMemory(&local_a8,vki,vk,physicalDevice,device,
                   (VkBuffer)
                   (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                   m_internal,in_stack_ffffffffffffff48);
  stack0xffffffffffffffa8 =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
  pVStack_50 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator;
  local_68._0_8_ = local_a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
  local_68._8_8_ =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = 0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_00.m_internal =
       (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              (&(this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,obj_00
              );
  }
  pMVar1 = &this->m_memory;
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
       stack0xffffffffffffffa8;
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       pVStack_50;
  *(undefined4 *)&(pMVar1->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.object.m_internal =
       local_68._0_4_;
  *(undefined4 *)
   ((long)&(this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal +
   4) = local_68._4_4_;
  *(undefined4 *)
   &(this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       local_68._8_4_;
  *(undefined4 *)
   ((long)&(this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
           m_deviceIface + 4) = local_68._12_4_;
  if (local_a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              (&local_a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,
               (VkDeviceMemory)
               local_a8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal);
  }
  result = (*vk->_vptr_DeviceInterface[7])
                     (vk,device,
                      (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
                      m_internal,0,this->m_bufferSize,0,(VkBufferCreateInfo *)local_68);
  ::vk::checkResult(result,"vkd.mapMemory(device, memory, 0, size, 0, &ptr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0x2b3);
  uVar3 = local_68._0_8_;
  deRandom_init((deRandom *)local_68,this->m_seed);
  size = this->m_bufferSize;
  if (size != 0) {
    uVar5 = 0;
    do {
      dVar4 = deRandom_getUint32((deRandom *)local_68);
      *(char *)(uVar3 + uVar5) = (char)dVar4;
      uVar5 = uVar5 + 1;
      size = this->m_bufferSize;
    } while (uVar5 < size);
  }
  ::vk::flushMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.object.m_internal,0,size
            );
  (*vk->_vptr_DeviceInterface[8])
            (vk,device,
             (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.object.m_internal);
  if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BufferCopyFromBuffer::prepare (PrepareContext& context)
{
	const vk::InstanceInterface&	vki				= context.getContext().getInstanceInterface();
	const vk::DeviceInterface&		vkd				= context.getContext().getDeviceInterface();
	const vk::VkPhysicalDevice		physicalDevice	= context.getContext().getPhysicalDevice();
	const vk::VkDevice				device			= context.getContext().getDevice();
	const vector<deUint32>&			queueFamilies	= context.getContext().getQueueFamilies();

	m_bufferSize	= context.getBufferSize();
	m_srcBuffer		= createBuffer(vkd, device, m_bufferSize, vk::VK_BUFFER_USAGE_TRANSFER_SRC_BIT, vk::VK_SHARING_MODE_EXCLUSIVE, queueFamilies);
	m_memory		= bindBufferMemory(vki, vkd, physicalDevice, device, *m_srcBuffer, vk::VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT);

	{
		void* const	ptr	= mapMemory(vkd, device, *m_memory, m_bufferSize);
		de::Random	rng	(m_seed);

		{
			deUint8* const	data = (deUint8*)ptr;

			for (size_t ndx = 0; ndx < (size_t)m_bufferSize; ndx++)
				data[ndx] = rng.getUint8();
		}

		vk::flushMappedMemoryRange(vkd, device, *m_memory, 0, m_bufferSize);
		vkd.unmapMemory(device, *m_memory);
	}
}